

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

void HTS_lsp2mgc(HTS_Vocoder *v,double *lsp,double *mgc,int m,double alpha)

{
  size_t sVar1;
  ulong uVar2;
  double __x;
  
  HTS_lsp2lpc(v,lsp + 1,mgc,m);
  __x = *lsp;
  if (v->use_log_gain != '\0') {
    __x = exp(__x);
  }
  *mgc = __x;
  HTS_ignorm(mgc,mgc,m,v->gamma);
  if (0 < m) {
    sVar1 = v->stage;
    uVar2 = (ulong)(uint)m + 1;
    do {
      mgc[uVar2 - 1] =
           mgc[uVar2 - 1] *
           -(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  HTS_mgc2mgc(v,mgc,m,alpha,v->gamma,mgc,m,alpha,v->gamma);
  return;
}

Assistant:

static void HTS_lsp2mgc(HTS_Vocoder * v, double *lsp, double *mgc, const int m, const double alpha)
{
   int i;
   /* lsp2lpc */
   HTS_lsp2lpc(v, lsp + 1, mgc, m);
   if (v->use_log_gain)
      mgc[0] = exp(lsp[0]);
   else
      mgc[0] = lsp[0];

   /* mgc2mgc */
   if (NORMFLG1)
      HTS_ignorm(mgc, mgc, m, v->gamma);
   else if (MULGFLG1)
      mgc[0] = (1.0 - mgc[0]) * ((double) v->stage);
   if (MULGFLG1)
      for (i = m; i >= 1; i--)
         mgc[i] *= -((double) v->stage);
   HTS_mgc2mgc(v, mgc, m, alpha, v->gamma, mgc, m, alpha, v->gamma);
   if (NORMFLG2)
      HTS_gnorm(mgc, mgc, m, v->gamma);
   else if (MULGFLG2)
      mgc[0] = mgc[0] * v->gamma + 1.0;
   if (MULGFLG2)
      for (i = m; i >= 1; i--)
         mgc[i] *= v->gamma;
}